

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O2

void __thiscall jaegertracing::samplers::Config::fromEnv(Config *this)

{
  istream *piVar1;
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *pcVar2;
  double paramVal;
  string param;
  string samplerType;
  string samplingServerURL;
  
  utils::EnvVariable::getStringVariable_abi_cxx11_
            (&samplerType,(EnvVariable *)"JAEGER_SAMPLER_TYPE",in_RDX);
  pcVar2 = extraout_RDX;
  if (samplerType._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)this);
    pcVar2 = extraout_RDX_00;
  }
  utils::EnvVariable::getStringVariable_abi_cxx11_
            (&param,(EnvVariable *)"JAEGER_SAMPLER_PARAM",pcVar2);
  pcVar2 = extraout_RDX_01;
  if (param._M_string_length != 0) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&samplingServerURL,(string *)&param,_S_in);
    piVar1 = std::istream::_M_extract<double>((double *)&samplingServerURL);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0) {
      this->_param = 0.0;
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&samplingServerURL);
    pcVar2 = extraout_RDX_02;
  }
  utils::EnvVariable::getStringVariable_abi_cxx11_
            (&samplingServerURL,(EnvVariable *)"JAEGER_SAMPLING_ENDPOINT",pcVar2);
  if (samplingServerURL._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this->_samplingServerURL);
  }
  std::__cxx11::string::~string((string *)&samplingServerURL);
  std::__cxx11::string::~string((string *)&param);
  std::__cxx11::string::~string((string *)&samplerType);
  return;
}

Assistant:

void Config::fromEnv()
{
    const auto samplerType = utils::EnvVariable::getStringVariable(kJAEGER_SAMPLER_TYPE_ENV_PROP);
    if (!samplerType.empty()) {
        _type = samplerType;
    }

    const auto param = utils::EnvVariable::getStringVariable(kJAEGER_SAMPLER_PARAM_ENV_PROP);
    if (!param.empty()) {
        std::istringstream iss(param);
        double paramVal = 0;
        if (iss >> paramVal) {
            _param = paramVal;
        }
    }
    const auto samplingServerURL = utils::EnvVariable::getStringVariable(kJAEGER_SAMPLING_ENDPOINT_ENV_PROP);
    if (!samplingServerURL.empty()) {
        _samplingServerURL = samplingServerURL;
    }
}